

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::RunContext::sectionEnded(RunContext *this,SectionInfo *info,Counts *prevAssertions)

{
  size_t *psVar1;
  RunningSection *pRVar2;
  IStreamingReporter *pIVar3;
  char cVar4;
  int iVar5;
  bool _missingAssertions;
  size_t sVar6;
  Counts local_c8;
  SectionStats local_b0;
  
  cVar4 = std::uncaught_exception();
  if (cVar4 == '\0') {
    local_c8.passed = (this->m_totals).assertions.passed - prevAssertions->passed;
    sVar6 = (this->m_totals).assertions.failed - prevAssertions->failed;
    local_c8.failed = sVar6;
    if (((local_c8.passed + sVar6 == 0) &&
        (iVar5 = (*(((this->m_config).m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[9])()
        , (char)iVar5 != '\0')) &&
       ((pRVar2 = this->m_runningTest->m_currentSection, pRVar2 == (RunningSection *)0x0 ||
        (pRVar2->m_state != Branch)))) {
      psVar1 = &(this->m_totals).assertions.failed;
      *psVar1 = *psVar1 + 1;
      local_c8.failed = sVar6 + 1;
      _missingAssertions = true;
    }
    else {
      _missingAssertions = false;
    }
    RunningTest::endSection(this->m_runningTest,&info->name,false);
    pIVar3 = (this->m_reporter).m_p;
    SectionStats::SectionStats(&local_b0,info,&local_c8,_missingAssertions);
    (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[0xc])(pIVar3,&local_b0);
    SectionStats::~SectionStats(&local_b0);
    std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::clear(&this->m_messages);
    return;
  }
  SectionInfo::SectionInfo((SectionInfo *)&local_b0,info);
  local_b0.sectionInfo.lineInfo.line = prevAssertions->passed;
  local_b0.assertions.passed = prevAssertions->failed;
  std::
  vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
  ::emplace_back<Catch::RunContext::UnfinishedSections>
            (&this->m_unfinishedSections,(UnfinishedSections *)&local_b0);
  SectionInfo::~SectionInfo((SectionInfo *)&local_b0);
  return;
}

Assistant:

virtual void sectionEnded( SectionInfo const& info, Counts const& prevAssertions ) {
            if( std::uncaught_exception() ) {
                m_unfinishedSections.push_back( UnfinishedSections( info, prevAssertions ) );
                return;
            }

            Counts assertions = m_totals.assertions - prevAssertions;
            bool missingAssertions = false;
            if( assertions.total() == 0 &&
                    m_config->warnAboutMissingAssertions() &&
                    !m_runningTest->isBranchSection() ) {
                m_totals.assertions.failed++;
                assertions.failed++;
                missingAssertions = true;

            }
            m_runningTest->endSection( info.name, false );

            m_reporter->sectionEnded( SectionStats( info, assertions, missingAssertions ) );
            m_messages.clear();
        }